

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# iterator.cpp
# Opt level: O1

int main(void)

{
  BinaryTree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_> BVar1
  ;
  NodePtr pNVar2;
  pointer pNVar3;
  pointer pNVar4;
  pointer pNVar5;
  pointer pNVar6;
  ostream *poVar7;
  NodePtr pNVar8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *member;
  BinaryTree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  family;
  BinaryTree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_120;
  pointer local_118;
  long *local_110;
  long local_108;
  long local_100 [2];
  long *local_f0;
  long local_e8;
  long local_e0 [2];
  long *local_d0;
  long local_c8;
  long local_c0 [2];
  long *local_b0;
  long local_a8;
  long local_a0 [2];
  long *local_90;
  long local_88;
  long local_80 [2];
  long *local_70;
  long local_68;
  long local_60 [2];
  long *local_50;
  long local_48;
  long local_40 [2];
  
  pNVar2 = (NodePtr)operator_new(0x40);
  local_50 = local_40;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_50,"me","");
  pNVar3 = (pointer)operator_new(0x40);
  local_70 = local_60;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_70,"mother","");
  pNVar4 = (pointer)operator_new(0x40);
  local_90 = local_80;
  local_118 = pNVar4;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_90,"mother\'s mother","");
  (pNVar4->value)._M_dataplus._M_p = (pointer)&(pNVar4->value).field_2;
  std::__cxx11::string::_M_construct<char*>((string *)pNVar4,local_90,local_88 + (long)local_90);
  pNVar4->left = (pointer)0x0;
  pNVar4->right = (pointer)0x0;
  pNVar4 = (pointer)operator_new(0x40);
  local_b0 = local_a0;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_b0,"mother\'s father","");
  (pNVar4->value)._M_dataplus._M_p = (pointer)&(pNVar4->value).field_2;
  std::__cxx11::string::_M_construct<char*>((string *)pNVar4,local_b0,local_a8 + (long)local_b0);
  pNVar4->left = (pointer)0x0;
  pNVar4->right = (pointer)0x0;
  (pNVar3->value)._M_dataplus._M_p = (pointer)&(pNVar3->value).field_2;
  std::__cxx11::string::_M_construct<char*>((string *)pNVar3,local_70,local_68 + (long)local_70);
  pNVar3->left = local_118;
  pNVar3->right = pNVar4;
  local_118->parent = pNVar3;
  pNVar4->parent = pNVar3;
  pNVar4 = (pointer)operator_new(0x40);
  local_d0 = local_c0;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_d0,"father","");
  pNVar5 = (pointer)operator_new(0x40);
  local_f0 = local_e0;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_f0,"father\'s mother","");
  (pNVar5->value)._M_dataplus._M_p = (pointer)&(pNVar5->value).field_2;
  std::__cxx11::string::_M_construct<char*>((string *)pNVar5,local_f0,local_e8 + (long)local_f0);
  pNVar5->left = (pointer)0x0;
  pNVar5->right = (pointer)0x0;
  pNVar6 = (pointer)operator_new(0x40);
  local_110 = local_100;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_110,"father\'s father","");
  (pNVar6->value)._M_dataplus._M_p = (pointer)&(pNVar6->value).field_2;
  std::__cxx11::string::_M_construct<char*>((string *)pNVar6,local_110,local_108 + (long)local_110);
  pNVar6->left = (pointer)0x0;
  pNVar6->right = (pointer)0x0;
  (pNVar4->value)._M_dataplus._M_p = (pointer)&(pNVar4->value).field_2;
  std::__cxx11::string::_M_construct<char*>((string *)pNVar4,local_d0,local_c8 + (long)local_d0);
  pNVar4->left = pNVar5;
  pNVar4->right = pNVar6;
  pNVar5->parent = pNVar4;
  pNVar6->parent = pNVar4;
  (pNVar2->value)._M_dataplus._M_p = (pointer)&(pNVar2->value).field_2;
  std::__cxx11::string::_M_construct<char*>((string *)pNVar2,local_50,local_48 + (long)local_50);
  pNVar2->left = pNVar3;
  pNVar2->right = pNVar4;
  pNVar3->parent = pNVar2;
  pNVar4->parent = pNVar2;
  local_120.root = pNVar2;
  if (local_110 != local_100) {
    operator_delete(local_110,local_100[0] + 1);
  }
  if (local_f0 != local_e0) {
    operator_delete(local_f0,local_e0[0] + 1);
  }
  if (local_d0 != local_c0) {
    operator_delete(local_d0,local_c0[0] + 1);
  }
  if (local_b0 != local_a0) {
    operator_delete(local_b0,local_a0[0] + 1);
  }
  if (local_90 != local_80) {
    operator_delete(local_90,local_80[0] + 1);
  }
  if (local_70 != local_60) {
    operator_delete(local_70,local_60[0] + 1);
  }
  BVar1.root = local_120.root;
  if (local_50 != local_40) {
    operator_delete(local_50,local_40[0] + 1);
    BVar1.root = local_120.root;
  }
  do {
    pNVar3 = BVar1.root;
    if (pNVar3 == (NodePtr)0x0) goto LAB_00101694;
    BVar1.root = pNVar3->left;
  } while (pNVar3->left != (pointer)0x0);
  do {
    poVar7 = std::__ostream_insert<char,std::char_traits<char>>
                       ((ostream *)&std::cout,(pNVar3->value)._M_dataplus._M_p,
                        (pNVar3->value)._M_string_length);
    std::ios::widen((char)*(undefined8 *)(*(long *)poVar7 + -0x18) + (char)poVar7);
    std::ostream::put((char)poVar7);
    std::ostream::flush();
    pNVar4 = pNVar3->right;
    if (pNVar3->right == (pointer)0x0) {
      pNVar2 = pNVar3->parent;
      while ((pNVar8 = pNVar2, pNVar8 != (NodePtr)0x0 && (pNVar3 == pNVar8->right))) {
        pNVar3 = pNVar8;
        pNVar2 = pNVar8->parent;
      }
      pNVar3 = pNVar3->parent;
    }
    else {
      do {
        pNVar3 = pNVar4;
        pNVar4 = pNVar3->left;
      } while (pNVar3->left != (pointer)0x0);
    }
  } while (pNVar3 != (pointer)0x0);
LAB_00101694:
  BinaryTree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~BinaryTree(&local_120);
  return 0;
}

Assistant:

int main()
{
	BinaryTree<std::string> family{
		new Node<std::string>{"me",
			new Node<std::string>{"mother",
				new Node<std::string>{"mother's mother"},
				new Node<std::string>{"mother's father"}
			},
			new Node<std::string>{"father",
				new Node<std::string>{"father's mother"},
				new Node<std::string>{"father's father"}
			}
		}
	};


	for(const auto& member : family)
	{
		std::cout << member << std::endl;
	}

	return 0;
}